

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_sse.c
# Opt level: O3

void uavs3d_if_cpy_w4_sse(pel *src,int i_src,pel *dst,int i_dst,int width,int height)

{
  uint uVar1;
  
  if (height < 4) {
    *(undefined4 *)dst = *(undefined4 *)src;
    *(undefined4 *)(dst + i_dst) = *(undefined4 *)(src + i_src);
    return;
  }
  uVar1 = height + 4;
  do {
    *(undefined4 *)dst = *(undefined4 *)src;
    *(undefined4 *)(dst + i_dst) = *(undefined4 *)(src + i_src);
    *(undefined4 *)(dst + i_dst * 2) = *(undefined4 *)(src + i_src * 2);
    *(undefined4 *)(dst + i_dst * 3) = *(undefined4 *)(src + i_src * 3);
    src = src + (i_src << 2);
    dst = dst + (i_dst << 2);
    uVar1 = uVar1 - 4;
  } while (4 < uVar1);
  return;
}

Assistant:

void uavs3d_if_cpy_w4_sse(const pel *src, int i_src, pel *dst, int i_dst, int width, int height)
{
    if (height < 4) {
        CP32(dst, src);
        CP32(dst + i_dst, src + i_src);
    }
    else {
        int i_src2 = i_src << 1;
        int i_dst2 = i_dst << 1;
        int i_src3 = i_src + i_src2;
        int i_dst3 = i_dst + i_dst2;
        int i_src4 = i_src << 2;
        int i_dst4 = i_dst << 2;
        while (height > 0) {
            CP32(dst, src);
            CP32(dst + i_dst, src + i_src);
            CP32(dst + i_dst2, src + i_src2);
            CP32(dst + i_dst3, src + i_src3);
            height -= 4;
            src += i_src4;
            dst += i_dst4;
        }
    }
}